

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O1

double __thiscall jrtplib::RTPSourceData::INF_GetEstimatedTimestampUnit(RTPSourceData *this)

{
  RTPNTPTime RVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = -1.0;
  if ((this->SRprevinf).hasinfo == true) {
    RVar1 = (this->SRinf).ntptimestamp;
    dVar5 = 0.0;
    dVar4 = 0.0;
    uVar2 = RVar1.msw;
    if (0x83aa7e7f < uVar2) {
      dVar4 = (double)((long)((double)((ulong)RVar1 >> 0x20) * 2.3283064365386963e-10 * 1000000.0) &
                      0xffffffff) * 1e-06 + (double)(uVar2 + 0x7c558180);
    }
    RVar1 = (this->SRprevinf).ntptimestamp;
    uVar2 = RVar1.msw;
    if (0x83aa7e7f < uVar2) {
      dVar5 = (double)((long)((double)((ulong)RVar1 >> 0x20) * 2.3283064365386963e-10 * 1000000.0) &
                      0xffffffff) * 1e-06 + (double)(uVar2 + 0x7c558180);
    }
    if ((((dVar4 != 0.0) || (NAN(dVar4))) && ((dVar5 != 0.0 || (NAN(dVar5))))) && (dVar5 < dVar4)) {
      dVar3 = (dVar4 - dVar5) /
              (double)((this->SRinf).rtptimestamp - (this->SRprevinf).rtptimestamp);
    }
  }
  return dVar3;
}

Assistant:

double RTPSourceData::INF_GetEstimatedTimestampUnit() const
{
	if (!SRprevinf.HasInfo())
		return -1.0;
	
	RTPTime t1 = RTPTime(SRinf.GetNTPTimestamp());
	RTPTime t2 = RTPTime(SRprevinf.GetNTPTimestamp());
	if (t1.IsZero() || t2.IsZero()) // one of the times couldn't be calculated
		return -1.0;

	if (t1 <= t2)
		return -1.0;

	t1 -= t2; // get the time difference
	
	uint32_t tsdiff = SRinf.GetRTPTimestamp()-SRprevinf.GetRTPTimestamp();
	
	return (t1.GetDouble()/((double)tsdiff));
}